

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O2

void __thiscall
slang::parsing::Preprocessor::handleProtectEncoding
          (Preprocessor *this,Token keyword,PragmaExpressionSyntax *args,
          SmallVectorBase<slang::parsing::Token> *param_3)

{
  SyntaxNode *pSVar1;
  bool bVar2;
  SyntaxNode *this_00;
  optional<unsigned_int> oVar3;
  Diagnostic *pDVar4;
  ProtectEncoding PVar5;
  SyntaxNode **ppSVar6;
  string_view sVar7;
  string_view arg;
  SourceRange SVar8;
  basic_string_view<char,_std::char_traits<char>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __y_03;
  basic_string_view<char,_std::char_traits<char>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  allocator<char> local_91;
  Token keyword_local;
  string valueText;
  Token value;
  const_iterator __begin2;
  string_view local_40;
  
  keyword_local.info = keyword.info;
  keyword_local._0_8_ = keyword._0_8_;
  if (args == (PragmaExpressionSyntax *)0x0) {
    SVar8 = Token::range(&keyword_local);
  }
  else {
    if (((args->super_SyntaxNode).kind == ParenPragmaExpression) &&
       (pSVar1 = args[3].super_SyntaxNode.previewNode, pSVar1 != (SyntaxNode *)0x0)) {
      this->protectLineLength = 0;
      this->protectBytes = 0;
      ppSVar6 = &args[1].super_SyntaxNode.previewNode;
      __begin2.index = 0;
      __begin2.list = (ParentList *)ppSVar6;
      do {
        if (__begin2.list == (ParentList *)ppSVar6 &&
            __begin2.index == (ulong)((long)&pSVar1->kind + 1) >> 1) {
          return;
        }
        this_00 = &slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
                   iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>::dereference
                             (&__begin2)->super_SyntaxNode;
        if (this_00->kind == NameValuePragmaExpression) {
          sVar7 = Token::valueText((Token *)(this_00 + 1));
          __y._M_str = "enctype";
          __y._M_len = 7;
          bVar2 = std::operator==(sVar7,__y);
          if (bVar2) {
            value = slang::syntax::SyntaxNode::getFirstToken(this_00[2].parent);
            local_40 = Token::valueText(&value);
            std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                      ((string *)&valueText,&local_40,&local_91);
            strToLower(&valueText);
            __y_00._M_str = valueText._M_dataplus._M_p;
            __y_00._M_len = valueText._M_string_length;
            __x._M_str = "uuencode";
            __x._M_len = 8;
            bVar2 = std::operator==(__x,__y_00);
            PVar5 = UUEncode;
            if (bVar2) {
LAB_001f86d6:
              this->protectEncoding = PVar5;
            }
            else {
              __y_01._M_str = valueText._M_dataplus._M_p;
              __y_01._M_len = valueText._M_string_length;
              __x_00._M_str = "base64";
              __x_00._M_len = 6;
              bVar2 = std::operator==(__x_00,__y_01);
              PVar5 = Base64;
              if (bVar2) goto LAB_001f86d6;
              __y_02._M_str = valueText._M_dataplus._M_p;
              __y_02._M_len = valueText._M_string_length;
              __x_01._M_str = "quoted-printable";
              __x_01._M_len = 0x10;
              bVar2 = std::operator==(__x_01,__y_02);
              PVar5 = QuotedPrintable;
              if (bVar2) goto LAB_001f86d6;
              __y_05._M_str = valueText._M_dataplus._M_p;
              __y_05._M_len = valueText._M_string_length;
              __x_02._M_str = "raw";
              __x_02._M_len = 3;
              bVar2 = std::operator==(__x_02,__y_05);
              this->protectEncoding = Raw;
              if (!bVar2) {
                SVar8 = Token::range(&value);
                pDVar4 = addDiag(this,(DiagCode)0x2c0004,SVar8);
                sVar7 = Token::valueText(&value);
                Diagnostic::operator<<(pDVar4,sVar7);
              }
            }
            std::__cxx11::string::~string((string *)&valueText);
          }
          else {
            __y_03._M_str = "line_length";
            __y_03._M_len = 0xb;
            bVar2 = std::operator==(sVar7,__y_03);
            if (bVar2) {
              oVar3 = requireUInt32(this,(PragmaExpressionSyntax *)this_00[2].parent);
              if (((ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                          super__Optional_payload_base<unsigned_int> & 0x100000000) != 0) {
                this->protectLineLength =
                     oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_int>._M_payload;
              }
            }
            else {
              __y_04._M_str = "bytes";
              __y_04._M_len = 5;
              bVar2 = std::operator==(sVar7,__y_04);
              if (bVar2) {
                oVar3 = requireUInt32(this,(PragmaExpressionSyntax *)this_00[2].parent);
                if (((ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_int> & 0x100000000) != 0) {
                  this->protectBytes =
                       oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int>._M_payload;
                }
              }
              else if (sVar7._M_len != 0) {
                SVar8 = Token::range((Token *)(this_00 + 1));
                pDVar4 = addDiag(this,(DiagCode)0x2e0004,SVar8);
                arg = Token::valueText(&keyword_local);
                pDVar4 = Diagnostic::operator<<(pDVar4,arg);
                goto LAB_001f871d;
              }
            }
          }
        }
        else {
          SVar8 = slang::syntax::SyntaxNode::sourceRange(this_00);
          pDVar4 = addDiag(this,(DiagCode)0x270004,SVar8);
          sVar7 = Token::valueText(&keyword_local);
LAB_001f871d:
          Diagnostic::operator<<(pDVar4,sVar7);
        }
        __begin2.index = __begin2.index + 1;
      } while( true );
    }
    SVar8 = slang::syntax::SyntaxNode::sourceRange(&args->super_SyntaxNode);
  }
  pDVar4 = addDiag(this,(DiagCode)0x270004,SVar8);
  sVar7 = Token::valueText(&keyword_local);
  Diagnostic::operator<<(pDVar4,sVar7);
  return;
}

Assistant:

void Preprocessor::handleProtectEncoding(Token keyword, const PragmaExpressionSyntax* args,
                                         SmallVectorBase<Token>&) {
    if (!args || args->kind != SyntaxKind::ParenPragmaExpression ||
        args->as<ParenPragmaExpressionSyntax>().values.empty()) {
        addDiag(diag::ProtectArgList, args ? args->sourceRange() : keyword.range())
            << keyword.valueText();
        return;
    }

    protectLineLength = 0;
    protectBytes = 0;

    for (auto arg : args->as<ParenPragmaExpressionSyntax>().values) {
        if (arg->kind != SyntaxKind::NameValuePragmaExpression) {
            addDiag(diag::ProtectArgList, arg->sourceRange()) << keyword.valueText();
            continue;
        }

        auto& nvp = arg->as<NameValuePragmaExpressionSyntax>();
        auto name = nvp.name.valueText();
        if (name == "enctype"sv) {
            auto value = nvp.value->getFirstToken();

            std::string valueText(value.valueText());
            strToLower(valueText);

            if (valueText == "uuencode"sv) {
                protectEncoding = ProtectEncoding::UUEncode;
            }
            else if (valueText == "base64"sv) {
                protectEncoding = ProtectEncoding::Base64;
            }
            else if (valueText == "quoted-printable"sv) {
                protectEncoding = ProtectEncoding::QuotedPrintable;
            }
            else if (valueText == "raw"sv) {
                protectEncoding = ProtectEncoding::Raw;
            }
            else {
                protectEncoding = ProtectEncoding::Raw;
                addDiag(diag::UnknownProtectEncoding, value.range()) << value.valueText();
            }
        }
        else if (name == "line_length"sv) {
            if (auto num = requireUInt32(*nvp.value))
                protectLineLength = *num;
        }
        else if (name == "bytes"sv) {
            if (auto num = requireUInt32(*nvp.value))
                protectBytes = *num;
        }
        else if (!name.empty()) {
            addDiag(diag::UnknownProtectOption, nvp.name.range()) << keyword.valueText() << name;
        }
    }
}